

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O1

Boxed_Value __thiscall
chaiscript::eval::Fun_Call_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
::do_eval_internal<false>
          (Fun_Call_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
          Dispatch_State *t_ss)

{
  long lVar1;
  undefined8 *puVar2;
  Proxy_Function_Base *params_00;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *puVar3;
  Boxed_Value BVar4;
  Const_Proxy_Function f;
  Boxed_Value fn;
  vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> params;
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [6];
  Boxed_Value local_68;
  undefined1 local_58 [24];
  Type_Conversions_State local_40;
  
  chaiscript::detail::Dispatch_Engine::new_function_call
            ((Dispatch_Engine *)*in_RDX,(Stack_Holder *)in_RDX[1],(Conversion_Saves *)in_RDX[3]);
  local_58._0_8_ = (pointer)0x0;
  local_58._8_8_ = (Type_Conversions *)0x0;
  local_58._16_8_ = (pointer)0x0;
  lVar1 = *(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                           _M_rwlock + 8);
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::reserve
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_58,
             *(long *)(lVar1 + 0x58) - *(long *)(lVar1 + 0x50) >> 3);
  lVar1 = *(long *)((long)&((t_ss[2].m_conversions.m_conversions._M_data)->m_mutex)._M_impl.
                           _M_rwlock + 8);
  puVar3 = *(undefined8 **)(lVar1 + 0x50);
  puVar2 = *(undefined8 **)(lVar1 + 0x58);
  local_d0[0]._0_8_ = t_ss;
  if (puVar3 != puVar2) {
    do {
      AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
                 local_f0,(Dispatch_State *)*puVar3);
      std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::
      emplace_back<chaiscript::Boxed_Value>
                ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)
                 local_58,(Boxed_Value *)local_f0);
      if ((Conversion_Saves *)local_f0._8_8_ != (Conversion_Saves *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
      }
      puVar3 = puVar3 + 1;
    } while (puVar3 != puVar2);
  }
  AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
            ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *)
             &local_68,
             (Dispatch_State *)
             (((((Type_Conversions_State *)(local_d0[0]._M_allocated_capacity + 0x50))->
               m_conversions)._M_data)->m_mutex)._M_impl._M_rwlock.__align);
  lVar1 = *in_RDX;
  local_40.m_saves._M_data = Type_Conversions::conversion_saves((Type_Conversions *)(lVar1 + 0x38));
  local_40.m_conversions._M_data = (Type_Conversions *)(lVar1 + 0x38);
  params_00 = boxed_cast<chaiscript::dispatch::Proxy_Function_Base_const*>(&local_68,&local_40);
  local_f0._0_8_ = local_58._0_8_;
  if (local_58._0_8_ == local_58._8_8_) {
    local_f0._0_8_ = (Type_Conversions *)0x0;
  }
  local_f0._8_8_ = local_58._8_8_;
  if (local_58._0_8_ == local_58._8_8_) {
    local_f0._8_8_ = (Type_Conversions *)0x0;
  }
  dispatch::Proxy_Function_Base::operator()
            ((Proxy_Function_Base *)this,(Function_Params *)params_00,
             (Type_Conversions_State *)local_f0);
  if (local_68.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::~vector
            ((vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *)local_58);
  chaiscript::detail::Dispatch_Engine::pop_function_call
            ((Dispatch_Engine *)*in_RDX,(Stack_Holder *)in_RDX[1],(Conversion_Saves *)in_RDX[3]);
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const {
        chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);

        std::vector<Boxed_Value> params;

        params.reserve(this->children[1]->children.size());
        for (const auto &child : this->children[1]->children) {
          params.push_back(child->eval(t_ss));
        }

        if (Save_Params) {
          fpp.save_params(Function_Params{params});
        }

        Boxed_Value fn(this->children[0]->eval(t_ss));

        try {
          return (*t_ss->boxed_cast<const dispatch::Proxy_Function_Base *>(fn))(Function_Params{params}, t_ss.conversions());
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error(std::string(e.what()) + " with function '" + this->children[0]->text + "'",
                                      e.parameters,
                                      e.functions,
                                      false,
                                      *t_ss);
        } catch (const exception::bad_boxed_cast &) {
          try {
            using ConstFunctionTypeRef = const Const_Proxy_Function &;
            Const_Proxy_Function f = t_ss->boxed_cast<ConstFunctionTypeRef>(fn);
            // handle the case where there is only 1 function to try to call and dispatch fails on it
            throw exception::eval_error("Error calling function '" + this->children[0]->text + "'", params, make_vector(f), false, *t_ss);
          } catch (const exception::bad_boxed_cast &) {
            throw exception::eval_error("'" + this->children[0]->pretty_print() + "' does not evaluate to a function.");
          }
        } catch (const exception::arity_error &e) {
          throw exception::eval_error(std::string(e.what()) + " with function '" + this->children[0]->text + "'");
        } catch (const exception::guard_error &e) {
          throw exception::eval_error(std::string(e.what()) + " with function '" + this->children[0]->text + "'");
        } catch (detail::Return_Value &rv) {
          return rv.retval;
        }
      }